

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

ConstTokenOrSyntax * __thiscall
slang::syntax::ClockingPropertyExprSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ClockingPropertyExprSyntax *this,size_t index)

{
  __index_type _Var1;
  TimingControlSyntax *pTVar2;
  
  if (index == 1) {
    pTVar2 = (TimingControlSyntax *)this->expr;
  }
  else {
    if (index != 0) {
      parsing::Token::Token((Token *)__return_storage_ptr__);
      _Var1 = '\0';
      goto LAB_00295634;
    }
    pTVar2 = (this->event).ptr;
    if (pTVar2 == (TimingControlSyntax *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<slang::syntax::TimingControlSyntax *>::get() const [T = slang::syntax::TimingControlSyntax *]"
                );
    }
  }
  *(TimingControlSyntax **)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pTVar2;
  _Var1 = '\x01';
LAB_00295634:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var1;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ClockingPropertyExprSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return event.get();
        case 1: return expr;
        default: return nullptr;
    }
}